

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Matchers::Impl::StdString::Contains::match(Contains *this,string *expr)

{
  long lVar1;
  undefined1 local_38 [40];
  string *expr_local;
  Contains *this_local;
  
  local_38._32_8_ = expr;
  expr_local = (string *)this;
  CasedString::adjustString((CasedString *)local_38,(string *)&this->m_data);
  lVar1 = std::__cxx11::string::find((string *)local_38,(ulong)&(this->m_data).m_str);
  std::__cxx11::string::~string((string *)local_38);
  return lVar1 != -1;
}

Assistant:

virtual bool match( std::string const& expr ) const {
                return m_data.adjustString( expr ).find( m_data.m_str ) != std::string::npos;
            }